

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

TValue * luaH_getstr(Table *t,TString *key)

{
  Node *in_RAX;
  TValue *pTVar1;
  Node *pNVar2;
  long lVar3;
  bool bVar4;
  TValue ko;
  Value local_10;
  uint local_8;
  
  if (key->tt != 4) {
    local_8 = key->tt | 0x40;
    local_10 = (Value)key;
    pTVar1 = getgeneric(t,(TValue *)&local_10);
    return pTVar1;
  }
  pNVar2 = t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash);
  do {
    pTVar1 = &pNVar2->i_val;
    if (((((Node *)pTVar1)->i_key).nk.tt_ == 0x44) &&
       ((TString *)(((Node *)pTVar1)->i_key).nk.value_.gc == key)) {
      bVar4 = false;
      pNVar2 = (Node *)pTVar1;
    }
    else {
      lVar3 = (long)(((Node *)pTVar1)->i_key).nk.next;
      pNVar2 = (Node *)((long)pTVar1 + lVar3 * 0x20);
      bVar4 = lVar3 != 0;
      pTVar1 = &in_RAX->i_val;
      if (!bVar4) {
        pTVar1 = &luaO_nilobject_;
      }
    }
    in_RAX = (Node *)pTVar1;
  } while (bVar4);
  return pTVar1;
}

Assistant:

const TValue *luaH_getstr (Table *t, TString *key) {
  if (key->tt == LUA_VSHRSTR)
    return luaH_getshortstr(t, key);
  else {  /* for long strings, use generic case */
    TValue ko;
    setsvalue(cast(lua_State *, NULL), &ko, key);
    return getgeneric(t, &ko);
  }
}